

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderNextSibling(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  xmlTextReaderState xVar4;
  
  iVar1 = -1;
  if (((reader == (xmlTextReaderPtr)0x0) || (reader->doc == (xmlDocPtr)0x0)) ||
     (iVar1 = 0, reader->state == XML_TEXTREADER_END)) {
    return iVar1;
  }
  if (reader->node != (xmlNodePtr)0x0) {
    p_Var3 = reader->node->next;
    if (p_Var3 == (_xmlNode *)0x0) {
      return 0;
    }
    reader->node = p_Var3;
    reader->state = XML_TEXTREADER_START;
    return 1;
  }
  if (reader->state == XML_TEXTREADER_END) {
    return 0;
  }
  pxVar2 = reader->node;
  if (pxVar2 == (xmlNodePtr)0x0) {
    p_Var3 = reader->doc->children;
    if (p_Var3 == (_xmlNode *)0x0) {
      iVar1 = 0;
      xVar4 = XML_TEXTREADER_END;
      goto LAB_0016da97;
    }
LAB_0016da8d:
    reader->node = p_Var3;
  }
  else {
    if (reader->state != XML_TEXTREADER_BACKTRACK) {
      p_Var3 = pxVar2->next;
      if (p_Var3 != (_xmlNode *)0x0) goto LAB_0016da8d;
      reader->state = XML_TEXTREADER_BACKTRACK;
      xmlTextReaderRead(reader);
      pxVar2 = reader->node;
    }
    if (pxVar2->next == (_xmlNode *)0x0) {
      p_Var3 = pxVar2->parent;
      iVar1 = 1;
      xVar4 = XML_TEXTREADER_END;
      if (p_Var3 != (_xmlNode *)0x0) {
        if (p_Var3->type == XML_DOCUMENT_NODE) {
          iVar1 = 0;
        }
        else {
          reader->node = p_Var3;
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
          xmlTextReaderNextTree(reader);
        }
      }
      goto LAB_0016da97;
    }
    reader->node = pxVar2->next;
  }
  iVar1 = 1;
  xVar4 = XML_TEXTREADER_START;
LAB_0016da97:
  reader->state = xVar4;
  return iVar1;
}

Assistant:

int
xmlTextReaderNextSibling(xmlTextReaderPtr reader) {
    if (reader == NULL)
        return(-1);
    if (reader->doc == NULL) {
        /* TODO */
	return(-1);
    }

    if (reader->state == XML_TEXTREADER_END)
        return(0);

    if (reader->node == NULL)
        return(xmlTextReaderNextTree(reader));

    if (reader->node->next != NULL) {
        reader->node = reader->node->next;
        reader->state = XML_TEXTREADER_START;
        return(1);
    }

    return(0);
}